

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int allocate_ack_eliciting_frame
              (quicly_conn_t *conn,quicly_send_context_t *s,size_t min_space,quicly_sent_t **sent,
              quicly_sent_acked_cb acked)

{
  int iVar1;
  st_quicly_sent_block_t *psVar2;
  size_t sVar3;
  quicly_sent_t *pqVar4;
  
  iVar1 = _do_allocate_frame(conn,s,min_space,1);
  if (iVar1 != 0) {
    return iVar1;
  }
  psVar2 = (conn->egress).loss.sentmap.tail;
  if ((psVar2 == (st_quicly_sent_block_t *)0x0) || (sVar3 = psVar2->next_insert_at, sVar3 == 0x10))
  {
    psVar2 = quicly_sentmap__new_block(&(conn->egress).loss.sentmap);
    if (psVar2 == (st_quicly_sent_block_t *)0x0) {
      pqVar4 = (quicly_sent_t *)0x0;
      goto LAB_0011a653;
    }
    sVar3 = psVar2->next_insert_at;
  }
  psVar2->next_insert_at = sVar3 + 1;
  pqVar4 = psVar2->entries + sVar3;
  psVar2->num_entries = psVar2->num_entries + 1;
  pqVar4->acked = acked;
LAB_0011a653:
  *sent = pqVar4;
  iVar1 = 0x201;
  if (pqVar4 != (quicly_sent_t *)0x0) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int allocate_ack_eliciting_frame(quicly_conn_t *conn, quicly_send_context_t *s, size_t min_space, quicly_sent_t **sent,
                                        quicly_sent_acked_cb acked)
{
    int ret;

    if ((ret = _do_allocate_frame(conn, s, min_space, 1)) != 0)
        return ret;
    if ((*sent = quicly_sentmap_allocate(&conn->egress.loss.sentmap, acked)) == NULL)
        return PTLS_ERROR_NO_MEMORY;

    return ret;
}